

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmMMU_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmPFlusha<(moira::Instr)180,(moira::Mode)12,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  char *pcVar2;
  uint uVar3;
  long lVar4;
  char cVar5;
  
  uVar1 = *addr;
  *addr = uVar1 + 2;
  uVar3 = (*this->_vptr_Moira[6])();
  if (((str->style->syntax & ~MOIRA_MIT) == GNU) && ((uVar3 & 0x1ff) != 0 || (op & 0xff) != 0)) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)180,(moira::Mode)12,4>(this,str,addr,op);
    return;
  }
  cVar5 = 'p';
  lVar4 = 1;
  do {
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = cVar5;
    cVar5 = "pflusha"[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  return;
}

Assistant:

void
Moira::dasmPFlusha(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead<Word>(addr);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExtMMU(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    str << Ins<I>{};
}